

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove5<(moira::Instr)71,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  undefined1 uVar1;
  uint val;
  bool bVar2;
  bool bVar3;
  
  val = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  bVar3 = SUB41(val >> 0x1f,0);
  (this->reg).sr.n = bVar3;
  uVar1 = false;
  if (val < 0x10000) {
    uVar1 = (this->reg).sr.z;
  }
  (this->reg).sr.z = (bool)uVar1;
  bVar2 = writeOp<(moira::Mode)5,(moira::Size)4,0ul>(this,opcode >> 9 & 7,val);
  if (bVar2) {
    prefetch<4ul>(this);
    (this->reg).sr.n = bVar3;
    (this->reg).sr.z = val == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove5(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_DI,S> (dst, data)) return;
    prefetch<POLLIPL>();
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}